

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexHullHelpers.cpp
# Opt level: O1

Polygon * __thiscall
iDynTree::Polygon::applyTransform
          (Polygon *__return_storage_ptr__,Polygon *this,Transform *newFrame_X_oldFrame)

{
  long lVar1;
  ulong uVar2;
  Transform aTStack_48 [24];
  
  Polygon(__return_storage_ptr__);
  std::vector<iDynTree::Position,_std::allocator<iDynTree::Position>_>::resize
            (&__return_storage_ptr__->m_vertices,
             ((long)(this->m_vertices).
                    super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_vertices).
                    super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  if ((this->m_vertices).super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_vertices).super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      iDynTree::Transform::operator*(aTStack_48,(Position *)newFrame_X_oldFrame);
      iDynTree::Position::operator=
                ((__return_storage_ptr__->m_vertices).
                 super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl
                 .super__Vector_impl_data._M_start + lVar1,(Position *)aTStack_48);
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x18;
    } while (uVar2 < (ulong)(((long)(this->m_vertices).
                                    super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_vertices).
                                    super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  return __return_storage_ptr__;
}

Assistant:

Polygon Polygon::applyTransform(const Transform &newFrame_X_oldFrame) const
    {
        Polygon ret;

        assert(this->isValid());

        ret.setNrOfVertices(this->getNrOfVertices());

        for (size_t i=0; i < this->getNrOfVertices(); i++)
        {
            ret(i) = newFrame_X_oldFrame*this->operator()(i);
        }

        return ret;
    }